

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

void __thiscall converter::rmp(converter *this)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  undefined1 local_50 [40];
  
  for (p_Var1 = (this->commandmp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->commandmp)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<int_&,_true>((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_50,(int *)(p_Var1 + 2),
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var1 + 1));
    std::
    _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<int,std::__cxx11::string>>
              ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                *)&this->rcommandmp,
               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  return;
}

Assistant:

void converter::rmp(){
    for(auto it=commandmp.begin();it!=commandmp.end();it++)
        rcommandmp.insert(std::pair<int,std::string>(it->second,it->first)); 
}